

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::AndroidPowerConfig::operator==
          (AndroidPowerConfig *this,AndroidPowerConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if ((((_Var1) && (this->battery_poll_ms_ == other->battery_poll_ms_)) &&
      (bVar2 = ::std::operator==(&this->battery_counters_,&other->battery_counters_), bVar2)) &&
     (this->collect_power_rails_ == other->collect_power_rails_)) {
    return this->collect_energy_estimation_breakdown_ == other->collect_energy_estimation_breakdown_
    ;
  }
  return false;
}

Assistant:

bool AndroidPowerConfig::operator==(const AndroidPowerConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && battery_poll_ms_ == other.battery_poll_ms_
   && battery_counters_ == other.battery_counters_
   && collect_power_rails_ == other.collect_power_rails_
   && collect_energy_estimation_breakdown_ == other.collect_energy_estimation_breakdown_;
}